

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O0

bool __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
pop<depspawn::internal::TaskPool::Task*>
          (queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_> *this,
          Task **ret)

{
  bool bVar1;
  index_t iVar2;
  tag_t tVar3;
  tagged_index __i;
  node *pnVar4;
  fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
  *in_RDI;
  tagged_node_handle new_head;
  tagged_node_handle new_tail;
  tagged_node_handle head2;
  node *next_ptr;
  tagged_node_handle next;
  tagged_node_handle tail;
  node *head_ptr;
  tagged_node_handle head;
  tagged_node_handle *in_stack_ffffffffffffff98;
  index_t in_stack_ffffffffffffffa0;
  index_t in_stack_ffffffffffffffa2;
  uint in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  tagged_node_handle in_stack_ffffffffffffffb4;
  tagged_node_handle in_stack_ffffffffffffffb8;
  tagged_index in_stack_ffffffffffffffbc;
  tagged_index local_40;
  tagged_index local_1c [7];
  
  while( true ) {
    while( true ) {
      do {
        local_1c[0] = std::atomic<boost::lockfree::detail::tagged_index>::load
                                ((atomic<boost::lockfree::detail::tagged_index> *)in_RDI,
                                 memory_order_acquire);
        pnVar4 = detail::
                 fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                 ::get_pointer((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                                *)CONCAT44(in_stack_ffffffffffffffa4,
                                           CONCAT22(in_stack_ffffffffffffffa2,
                                                    in_stack_ffffffffffffffa0)),
                               in_stack_ffffffffffffff98);
        std::atomic<boost::lockfree::detail::tagged_index>::load
                  (&in_RDI[2].pool_,memory_order_acquire);
        std::atomic<boost::lockfree::detail::tagged_index>::load(&pnVar4->next,memory_order_acquire)
        ;
        pnVar4 = detail::
                 fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                 ::get_pointer((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                                *)CONCAT44(in_stack_ffffffffffffffa4,
                                           CONCAT22(in_stack_ffffffffffffffa2,
                                                    in_stack_ffffffffffffffa0)),
                               in_stack_ffffffffffffff98);
        __i = std::atomic<boost::lockfree::detail::tagged_index>::load
                        ((atomic<boost::lockfree::detail::tagged_index> *)in_RDI,
                         memory_order_acquire);
        bVar1 = detail::tagged_index::operator==(local_1c,(tagged_index *)&stack0xffffffffffffffc4);
      } while (!bVar1);
      iVar2 = detail::
              fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
              ::get_handle((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                            *)CONCAT44(in_stack_ffffffffffffffa4,
                                       CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)
                                      ),in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffa4 = (uint)iVar2;
      iVar2 = detail::
              fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
              ::get_handle((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                            *)(ulong)CONCAT24(iVar2,CONCAT22(in_stack_ffffffffffffffa2,
                                                             in_stack_ffffffffffffffa0)),
                           in_stack_ffffffffffffff98);
      if (in_stack_ffffffffffffffa4 == iVar2) break;
      if (pnVar4 != (node *)0x0) {
        detail::
        copy_payload<depspawn::internal::TaskPool::Task*,depspawn::internal::TaskPool::Task*>
                  ((Task **)CONCAT44(in_stack_ffffffffffffffa4,
                                     CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)),
                   (Task **)in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffa0 =
             detail::
             fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
             ::get_handle((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                           *)CONCAT44(in_stack_ffffffffffffffa4,
                                      CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0))
                          ,in_stack_ffffffffffffff98);
        tVar3 = detail::tagged_index::get_next_tag
                          ((tagged_index *)
                           CONCAT44(in_stack_ffffffffffffffa4,
                                    CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)));
        in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb8;
        detail::tagged_index::tagged_index
                  ((tagged_index *)&stack0xffffffffffffffb8,in_stack_ffffffffffffffa0,tVar3);
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb4;
        bVar1 = std::atomic<boost::lockfree::detail::tagged_index>::compare_exchange_weak
                          ((atomic<boost::lockfree::detail::tagged_index> *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb4),
                           (tagged_index *)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),__i,
                           (memory_order)((ulong)in_RDI >> 0x20));
        if (bVar1) {
          detail::
          fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
          ::destruct<true>(in_RDI,in_stack_ffffffffffffffb4);
          return true;
        }
      }
    }
    if (pnVar4 == (node *)0x0) break;
    in_stack_ffffffffffffffa2 =
         detail::
         fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
         ::get_handle((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                       *)CONCAT44(in_stack_ffffffffffffffa4,
                                  CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)),
                      in_stack_ffffffffffffff98);
    tVar3 = detail::tagged_index::get_next_tag
                      ((tagged_index *)
                       CONCAT44(in_stack_ffffffffffffffa4,
                                CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)));
    detail::tagged_index::tagged_index(&local_40,in_stack_ffffffffffffffa2,tVar3);
    in_stack_ffffffffffffffbc = local_40;
    std::atomic<boost::lockfree::detail::tagged_index>::compare_exchange_strong
              ((atomic<boost::lockfree::detail::tagged_index> *)
               CONCAT44(local_40,in_stack_ffffffffffffffb8),
               (tagged_index *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),__i,
               (memory_order)((ulong)in_RDI >> 0x20));
  }
  return false;
}

Assistant:

bool pop (U & ret)
    {
        for (;;) {
            tagged_node_handle head = head_.load(memory_order_acquire);
            node * head_ptr = pool.get_pointer(head);

            tagged_node_handle tail = tail_.load(memory_order_acquire);
            tagged_node_handle next = head_ptr->next.load(memory_order_acquire);
            node * next_ptr = pool.get_pointer(next);

            tagged_node_handle head2 = head_.load(memory_order_acquire);
            if (BOOST_LIKELY(head == head2)) {
                if (pool.get_handle(head) == pool.get_handle(tail)) {
                    if (next_ptr == 0)
                        return false;

                    tagged_node_handle new_tail(pool.get_handle(next), tail.get_next_tag());
                    tail_.compare_exchange_strong(tail, new_tail);

                } else {
                    if (next_ptr == 0)
                        /* this check is not part of the original algorithm as published by michael and scott
                         *
                         * however we reuse the tagged_ptr part for the freelist and clear the next part during node
                         * allocation. we can observe a null-pointer here.
                         * */
                        continue;
                    detail::copy_payload(next_ptr->data, ret);

                    tagged_node_handle new_head(pool.get_handle(next), head.get_next_tag());
                    if (head_.compare_exchange_weak(head, new_head)) {
                        pool.template destruct<true>(head);
                        return true;
                    }
                }
            }
        }
    }